

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.c
# Opt level: O0

int16_t av1_ac_quant_QTX(int qindex,int delta,aom_bit_depth_t bit_depth)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int q_clamped;
  int16_t local_2;
  
  iVar1 = clamp(in_EDI + in_ESI,0,0xff);
  if (in_EDX == 8) {
    local_2 = ac_qlookup_QTX[iVar1];
  }
  else if (in_EDX == 10) {
    local_2 = ac_qlookup_10_QTX[iVar1];
  }
  else if (in_EDX == 0xc) {
    local_2 = ac_qlookup_12_QTX[iVar1];
  }
  else {
    local_2 = -1;
  }
  return local_2;
}

Assistant:

int16_t av1_ac_quant_QTX(int qindex, int delta, aom_bit_depth_t bit_depth) {
  const int q_clamped = clamp(qindex + delta, 0, MAXQ);
  switch (bit_depth) {
    case AOM_BITS_8: return ac_qlookup_QTX[q_clamped];
    case AOM_BITS_10: return ac_qlookup_10_QTX[q_clamped];
    case AOM_BITS_12: return ac_qlookup_12_QTX[q_clamped];
    default:
      assert(0 && "bit_depth should be AOM_BITS_8, AOM_BITS_10 or AOM_BITS_12");
      return -1;
  }
}